

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void bc_trie_foreach(bc_trie_t *trie,bc_trie_foreach_func_t func,void *user_data)

{
  bc_string_t *str_00;
  bc_string_t *str;
  void *user_data_local;
  bc_trie_foreach_func_t func_local;
  bc_trie_t *trie_local;
  
  if (((trie != (bc_trie_t *)0x0) && (trie->root != (bc_trie_node_t *)0x0)) &&
     (func != (bc_trie_foreach_func_t)0x0)) {
    str_00 = bc_string_new();
    bc_trie_foreach_node(trie->root,str_00,func,user_data);
    bc_string_free(str_00,true);
  }
  return;
}

Assistant:

void
bc_trie_foreach(bc_trie_t *trie, bc_trie_foreach_func_t func,
    void *user_data)
{
    if (trie == NULL || trie->root == NULL || func == NULL)
        return;

    bc_string_t *str = bc_string_new();
    bc_trie_foreach_node(trie->root, str, func, user_data);
    bc_string_free(str, true);
}